

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QMimeMagicRuleMatcher>::emplace<QMimeMagicRuleMatcher_const&>
          (QMovableArrayOps<QMimeMagicRuleMatcher> *this,qsizetype i,QMimeMagicRuleMatcher *args)

{
  bool bVar1;
  qsizetype qVar2;
  QMimeMagicRuleMatcher *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QMimeMagicRuleMatcher tmp;
  QMimeMagicRuleMatcher *in_stack_ffffffffffffff48;
  QMimeMagicRuleMatcher *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  undefined1 uVar3;
  GrowthPosition in_stack_ffffffffffffff6c;
  QArrayDataPointer<QMimeMagicRuleMatcher> *in_stack_ffffffffffffff70;
  Inserter local_68;
  undefined1 local_40 [56];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QArrayDataPointer<QMimeMagicRuleMatcher>::needsDetach
                    ((QArrayDataPointer<QMimeMagicRuleMatcher> *)in_stack_ffffffffffffff50);
  if (!bVar1) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar2 = QArrayDataPointer<QMimeMagicRuleMatcher>::freeSpaceAtEnd
                          ((QArrayDataPointer<QMimeMagicRuleMatcher> *)
                           CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58)),
       qVar2 != 0)) {
      QArrayDataPointer<QMimeMagicRuleMatcher>::end
                ((QArrayDataPointer<QMimeMagicRuleMatcher> *)in_stack_ffffffffffffff50);
      QMimeMagicRuleMatcher::QMimeMagicRuleMatcher
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      in_RDI->displaceTo = (QMimeMagicRuleMatcher *)((long)&(in_RDI->displaceTo->m_list).d.d + 1);
      goto LAB_0090b009;
    }
    if ((in_RSI == (QMimeMagicRuleMatcher *)0x0) &&
       (qVar2 = QArrayDataPointer<QMimeMagicRuleMatcher>::freeSpaceAtBegin
                          ((QArrayDataPointer<QMimeMagicRuleMatcher> *)
                           CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58)),
       qVar2 != 0)) {
      QArrayDataPointer<QMimeMagicRuleMatcher>::begin
                ((QArrayDataPointer<QMimeMagicRuleMatcher> *)0x90aeaa);
      QMimeMagicRuleMatcher::QMimeMagicRuleMatcher
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo = (QMimeMagicRuleMatcher *)((long)&(in_RDI->displaceTo->m_list).d.d + 1);
      goto LAB_0090b009;
    }
  }
  memset(local_40,0xaa,0x38);
  QMimeMagicRuleMatcher::QMimeMagicRuleMatcher(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  bVar1 = in_RDI->displaceTo != (QMimeMagicRuleMatcher *)0x0;
  uVar3 = bVar1 && in_RSI == (QMimeMagicRuleMatcher *)0x0;
  QArrayDataPointer<QMimeMagicRuleMatcher>::detachAndGrow
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,(qsizetype)in_RDI,
             (QMimeMagicRuleMatcher **)CONCAT17(uVar3,in_stack_ffffffffffffff58),
             (QArrayDataPointer<QMimeMagicRuleMatcher> *)in_stack_ffffffffffffff50);
  if (bVar1 && in_RSI == (QMimeMagicRuleMatcher *)0x0) {
    QArrayDataPointer<QMimeMagicRuleMatcher>::begin
              ((QArrayDataPointer<QMimeMagicRuleMatcher> *)0x90af65);
    QMimeMagicRuleMatcher::QMimeMagicRuleMatcher
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
    in_RDI->displaceTo = (QMimeMagicRuleMatcher *)((long)&(in_RDI->displaceTo->m_list).d.d + 1);
  }
  else {
    Inserter::Inserter(in_RDI,(QArrayDataPointer<QMimeMagicRuleMatcher> *)
                              CONCAT17(uVar3,in_stack_ffffffffffffff58),
                       (qsizetype)in_stack_ffffffffffffff50,(qsizetype)in_stack_ffffffffffffff48);
    Inserter::insertOne((Inserter *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    Inserter::~Inserter(&local_68);
  }
  QMimeMagicRuleMatcher::~QMimeMagicRuleMatcher(in_stack_ffffffffffffff50);
LAB_0090b009:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }